

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceSpec.cxx
# Opt level: O2

ReadFileResult __thiscall
cmCTestResourceSpec::ReadFromJSONFile(cmCTestResourceSpec *this,string *filename)

{
  long *plVar1;
  bool bVar2;
  ReadFileResult RVar3;
  Value *__args_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __position;
  ReadFileResult unaff_EBP;
  long *plVar4;
  TopVersion version;
  Members extraFields;
  Value root;
  undefined1 local_288 [32];
  CharReaderBuilder builder;
  ifstream fin;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&fin,(filename->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) {
    Json::Value::Value(&root,nullValue);
    Json::CharReaderBuilder::CharReaderBuilder(&builder);
    bVar2 = Json::parseFromStream(&builder.super_Factory,(IStream *)&fin,&root,(String *)0x0);
    if (bVar2) {
      version.Version.Major = 1;
      version.Version.Minor = 0;
      bVar2 = Json::Value::isObject(&root);
      RVar3 = DAT_008bca78;
      if (bVar2) {
        extraFields.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        extraFields.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        extraFields.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Json::Value::getMemberNames_abi_cxx11_((Members *)local_288,&root);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&extraFields,(String *)local_288);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_288);
        plVar1 = DAT_008bca60;
        plVar4 = (anonymous_namespace)::RootVersionHelper;
        do {
          if (plVar4 == plVar1) {
            unaff_EBP = (&DAT_008bca74)
                        [extraFields.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start !=
                         extraFields.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish & ~DAT_008bca7c];
            break;
          }
          local_288._0_8_ = local_288 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,plVar4[1],*plVar4 + plVar4[1]);
          bVar2 = Json::Value::isMember(&root,(String *)local_288);
          if (bVar2) {
            __args_1 = Json::Value::operator[](&root,(String *)local_288);
            RVar3 = std::
                    function<cmCTestResourceSpec::ReadFileResult_((anonymous_namespace)::TopVersion_&,_const_Json::Value_*)>
                    ::operator()((function<cmCTestResourceSpec::ReadFileResult_((anonymous_namespace)::TopVersion_&,_const_Json::Value_*)>
                                  *)(plVar4 + 2),&version,__args_1);
            if (RVar3 == DAT_008bca74) {
              __position = std::
                           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                     (extraFields.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      extraFields.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,(String *)local_288
                                     );
              bVar2 = true;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::erase(&extraFields,(const_iterator)__position._M_current);
            }
            else {
              bVar2 = false;
              unaff_EBP = RVar3;
            }
          }
          else if ((char)plVar4[6] == '\0') {
            RVar3 = std::
                    function<cmCTestResourceSpec::ReadFileResult_((anonymous_namespace)::TopVersion_&,_const_Json::Value_*)>
                    ::operator()((function<cmCTestResourceSpec::ReadFileResult_((anonymous_namespace)::TopVersion_&,_const_Json::Value_*)>
                                  *)(plVar4 + 2),&version,(Value *)0x0);
            bVar2 = RVar3 == DAT_008bca74;
            if (!bVar2) {
              unaff_EBP = RVar3;
            }
          }
          else {
            bVar2 = false;
            unaff_EBP = DAT_008bca78;
          }
          std::__cxx11::string::~string((string *)local_288);
          plVar4 = plVar4 + 7;
        } while (bVar2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&extraFields);
        RVar3 = unaff_EBP;
      }
      if (RVar3 == READ_OK) {
        RVar3 = UNSUPPORTED_VERSION;
        if ((version.Version.Major == 1) && (version.Version.Minor == 0)) {
          RVar3 = cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::
                  Object<cmCTestResourceSpec>::operator()
                            ((Object<cmCTestResourceSpec> *)(anonymous_namespace)::RootHelper,this,
                             &root);
        }
      }
    }
    else {
      RVar3 = JSON_PARSE_ERROR;
    }
    Json::CharReaderBuilder::~CharReaderBuilder(&builder);
    Json::Value::~Value(&root);
  }
  else {
    RVar3 = FILE_NOT_FOUND;
  }
  std::ifstream::~ifstream(&fin);
  return RVar3;
}

Assistant:

cmCTestResourceSpec::ReadFileResult cmCTestResourceSpec::ReadFromJSONFile(
  const std::string& filename)
{
  cmsys::ifstream fin(filename.c_str());
  if (!fin) {
    return ReadFileResult::FILE_NOT_FOUND;
  }

  Json::Value root;
  Json::CharReaderBuilder builder;
  if (!Json::parseFromStream(builder, fin, &root, nullptr)) {
    return ReadFileResult::JSON_PARSE_ERROR;
  }

  TopVersion version;
  ReadFileResult result;
  if ((result = RootVersionHelper(version, &root)) !=
      ReadFileResult::READ_OK) {
    return result;
  }
  if (version.Version.Major != 1 || version.Version.Minor != 0) {
    return ReadFileResult::UNSUPPORTED_VERSION;
  }

  return RootHelper(*this, &root);
}